

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayKernel.hh
# Opt level: O2

void __thiscall OpenMesh::ArrayKernel::request_edge_status(ArrayKernel *this)

{
  uint uVar1;
  string local_40;
  allocator local_19;
  
  uVar1 = this->refcount_estatus_;
  this->refcount_estatus_ = uVar1 + 1;
  if (uVar1 == 0) {
    std::__cxx11::string::string((string *)&local_40,"e:status",&local_19);
    BaseKernel::add_property<OpenMesh::Attributes::StatusInfo>
              (&this->super_BaseKernel,&this->edge_status_,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

void request_edge_status()
  {
    if (!refcount_estatus_++)
      add_property( edge_status_, "e:status" );
  }